

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Graph.h
# Opt level: O3

string * __thiscall
Graph<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::toString
          (string *__return_storage_ptr__,
          Graph<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          *this)

{
  long *plVar1;
  long *plVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  long *local_80;
  long local_70;
  long lStack_68;
  string *local_60;
  string local_58;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_38;
  
  local_38 = &__return_storage_ptr__->field_2;
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)local_38;
  std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"");
  local_60 = __return_storage_ptr__;
  if (this->vertexCount == 0) {
    std::__cxx11::string::append((char *)__return_storage_ptr__);
  }
  else if (0 < this->vertexCount) {
    lVar5 = 0;
    lVar4 = 0;
    lVar3 = 0;
    do {
      GraphVertex<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::toString(&local_58,
                 (GraphVertex<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)((long)&this->vertexList->index + lVar5));
      plVar1 = (long *)std::__cxx11::string::append((char *)&local_58);
      plVar2 = plVar1 + 2;
      if ((long *)*plVar1 == plVar2) {
        local_70 = *plVar2;
        lStack_68 = plVar1[3];
        local_80 = &local_70;
      }
      else {
        local_70 = *plVar2;
        local_80 = (long *)*plVar1;
      }
      *plVar1 = (long)plVar2;
      plVar1[1] = 0;
      *(undefined1 *)(plVar1 + 2) = 0;
      std::__cxx11::string::_M_append((char *)local_60,(ulong)local_80);
      if (local_80 != &local_70) {
        operator_delete(local_80,local_70 + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_58._M_dataplus._M_p != &local_58.field_2) {
        operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
      }
      SinglyLinkedList<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::toString(&local_58,
                 (SinglyLinkedList<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)((long)&this->adjacencyList->head + lVar4));
      plVar1 = (long *)std::__cxx11::string::append((char *)&local_58);
      plVar2 = plVar1 + 2;
      if ((long *)*plVar1 == plVar2) {
        local_70 = *plVar2;
        lStack_68 = plVar1[3];
        local_80 = &local_70;
      }
      else {
        local_70 = *plVar2;
        local_80 = (long *)*plVar1;
      }
      *plVar1 = (long)plVar2;
      plVar1[1] = 0;
      *(undefined1 *)(plVar1 + 2) = 0;
      std::__cxx11::string::_M_append((char *)local_60,(ulong)local_80);
      if (local_80 != &local_70) {
        operator_delete(local_80,local_70 + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_58._M_dataplus._M_p != &local_58.field_2) {
        operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
      }
      lVar3 = lVar3 + 1;
      lVar4 = lVar4 + 0x18;
      lVar5 = lVar5 + 0x48;
    } while (lVar3 < this->vertexCount);
  }
  return local_60;
}

Assistant:

std::string Graph<T>::toString()
{
  std::string output = "";
  if(vertexCount == 0)
  {
    output += "[]\n";
  }

  else
  {
    for(int i = 0; i < vertexCount; i++)
    {
      output += vertexList[i].toString() +" -> "; // Region/ Zone

      output += adjacencyList[i].toString() + "\n"; // Connected regions and zones
    }
  }

  return output;
}